

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int __thiscall CVmUTF8Source::seek(CVmUTF8Source *this,long ofs,int mode)

{
  size_t sVar1;
  byte *pbVar2;
  size_t sVar3;
  
  if (mode != 0) {
    if (mode == 2) {
      ofs = ofs + this->charlen;
    }
    else {
      if (mode != 1) {
        return 1;
      }
      ofs = ofs + this->charidx;
    }
  }
  sVar1 = this->charlen;
  if (ofs < (long)this->charlen) {
    sVar1 = ofs;
  }
  sVar3 = 0;
  if (-1 < ofs) {
    sVar3 = sVar1;
  }
  this->charidx = sVar3;
  pbVar2 = (byte *)this->str;
  while (sVar3 != 0) {
    pbVar2 = pbVar2 + (ulong)(((*pbVar2 >> 5 & 1) != 0) + 1 & (uint)(*pbVar2 >> 7) * 3) + 1;
    sVar1 = sVar1 - 1;
    sVar3 = sVar1;
  }
  this->byteidx = (long)pbVar2 - (long)this->str;
  return 0;
}

Assistant:

virtual int seek(long ofs, int mode)
    {
        /* figure the absolute position based on the mode */
        switch (mode)
        {
        case OSFSK_SET:
            /* set - the offset is already absolute */
            break;

        case OSFSK_CUR:
            /* relative to current index */
            ofs += charidx;
            break;

        case OSFSK_END:
            /* relative to the end of file */
            ofs += charlen;
            break;
            
        default:
            /* invalid mode - return an error */
            return 1;
        }

        /* limit the position to the bounds of the string */
        if (ofs < 0)
            ofs = 0;
        else if (ofs > (long)charlen)
            ofs = (long)charlen;

        /* 
         *   The caller is working with the stream: the byte index in the
         *   stream equals the character index in the string.
         */
        charidx = (size_t)ofs;

        /* calculate the byte index for the new character index */
        utf8_ptr p((char *)str);
        byteidx = p.bytelen(charidx);

        /* success */
        return 0;
    }